

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmCommandContext *cc,cmExecutionStatus *status)

{
  cmListFileContext *local_c0;
  cmListFileBacktrace local_b8 [2];
  string local_98;
  cmListFileContext local_78;
  cmListFileContext *local_30;
  cmListFileContext *lfc;
  cmExecutionStatus *status_local;
  cmCommandContext *cc_local;
  cmMakefile *mf_local;
  cmMakefileCall *this_local;
  
  this->Makefile = mf;
  lfc = (cmListFileContext *)status;
  status_local = (cmExecutionStatus *)cc;
  cc_local = (cmCommandContext *)mf;
  mf_local = (cmMakefile *)this;
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_98,&this->Makefile->StateSnapshot);
  cmListFileContext::FromCommandContext(&local_78,cc,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_30 = &local_78;
  cmListFileBacktrace::Push(local_b8,(cmListFileContext *)&this->Makefile->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,local_b8);
  cmListFileBacktrace::~cmListFileBacktrace(local_b8);
  this->Makefile->RecursionDepth = this->Makefile->RecursionDepth + 1;
  local_c0 = lfc;
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::push_back
            (&this->Makefile->ExecutionStatusStack,(value_type *)&local_c0);
  cmListFileContext::~cmListFileContext(&local_78);
  return;
}

Assistant:

cmMakefileCall(cmMakefile* mf, cmCommandContext const& cc,
                 cmExecutionStatus& status)
    : Makefile(mf)
  {
    cmListFileContext const& lfc = cmListFileContext::FromCommandContext(
      cc, this->Makefile->StateSnapshot.GetExecutionListFile());
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    ++this->Makefile->RecursionDepth;
    this->Makefile->ExecutionStatusStack.push_back(&status);
  }